

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O2

exr_result_t
exr_attr_list_remove(exr_context_t ctxt,exr_attribute_list_t *list,exr_attribute_t *attr)

{
  exr_attribute_t **ppeVar1;
  exr_attribute_t *peVar2;
  exr_result_t eVar3;
  ulong uVar4;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr *UNRECOVERED_JUMPTABLE;
  uint uVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if (attr == (exr_attribute_t *)0x0) {
    UNRECOVERED_JUMPTABLE = ctxt->report_error;
    pcVar6 = "NULL attribute passed to remove";
  }
  else if (list == (exr_attribute_list_t *)0x0) {
    UNRECOVERED_JUMPTABLE = ctxt->report_error;
    pcVar6 = "Invalid list pointer to remove attribute";
  }
  else {
    uVar5 = list->num_attributes;
    ppeVar1 = list->entries;
    uVar8 = 0;
    uVar4 = 0;
    if (0 < (int)uVar5) {
      uVar4 = (ulong)uVar5;
    }
    for (; uVar4 != uVar8; uVar8 = uVar8 + 1) {
      if (ppeVar1[uVar8] == attr) {
        ppeVar1[uVar8] = (exr_attribute_t *)0x0;
        uVar5 = uVar5 - 1;
        uVar9 = (ulong)uVar5;
        if ((int)uVar5 < (int)uVar8) {
          uVar9 = uVar8 & 0xffffffff;
        }
        for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
          ppeVar1[uVar8] = ppeVar1[uVar8 + 1];
        }
        list->num_attributes = uVar5;
        ppeVar1 = list->sorted_entries;
        iVar7 = 0;
        for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
          peVar2 = ppeVar1[uVar8];
          if (peVar2 != attr) {
            lVar10 = (long)iVar7;
            iVar7 = iVar7 + 1;
            ppeVar1[lVar10] = peVar2;
          }
        }
        eVar3 = attr_destroy(ctxt,attr);
        return eVar3;
      }
    }
    UNRECOVERED_JUMPTABLE = ctxt->report_error;
    pcVar6 = "Attribute not in list";
  }
  eVar3 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar6);
  return eVar3;
}

Assistant:

exr_result_t
exr_attr_list_remove (
    exr_context_t ctxt, exr_attribute_list_t* list, exr_attribute_t* attr)
{
    int               cattrsz, attridx = -1;
    exr_attribute_t** attrs;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!attr)
    {
        return ctxt->report_error (
            ctxt, EXR_ERR_INVALID_ARGUMENT, "NULL attribute passed to remove");
    }

    if (!list)
    {
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid list pointer to remove attribute");
    }

    cattrsz = list->num_attributes;
    attrs   = list->entries;
    for (int i = 0; i < cattrsz; ++i)
    {
        if (attrs[i] == attr)
        {
            attridx = i;
            break;
        }
    }

    if (attridx == -1)
    {
        return ctxt->report_error (
            ctxt, EXR_ERR_INVALID_ARGUMENT, "Attribute not in list");
    }

    list->entries[attridx] = NULL;
    for (int i = attridx; i < (cattrsz - 1); ++i)
        attrs[i] = attrs[i + 1];
    list->num_attributes = cattrsz - 1;

    attrs   = list->sorted_entries;
    attridx = 0;
    for (int i = 0; i < cattrsz; ++i)
    {
        if (attrs[i] == attr) continue;
        attrs[attridx++] = attrs[i];
    }

    return attr_destroy (ctxt, attr);
}